

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O1

bool __thiscall
pstore::romfs::directory::check
          (directory *this,not_null<const_pstore::romfs::directory_*> parent,
          check_stack_entry *visited)

{
  check_stack_entry **ppcVar1;
  pointer pvVar2;
  size_t sVar3;
  pointer pvVar4;
  directory *this_00;
  bool bVar5;
  bool bVar6;
  int iVar7;
  iterator d;
  iterator d_00;
  not_null<const_pstore::romfs::directory_*> *pnVar8;
  check_stack_entry *pcVar9;
  pointer pvVar10;
  long lVar11;
  dirent *__name;
  error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> od;
  check_stack_entry me;
  not_null<const_pstore::romfs::directory_*> local_68;
  anon_union_16_2_eb5a95ea_for_error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>_1
  local_60;
  bool local_50;
  check_stack_entry local_48;
  not_null<const_directory_*> local_38;
  
  sVar3 = this->size_;
  pvVar4 = (this->members_).ptr_;
  pcVar9 = visited;
  if (visited != (check_stack_entry *)0x0) {
    do {
      if ((pcVar9->d).ptr_ == parent.ptr_) {
        return true;
      }
      ppcVar1 = &pcVar9->prev;
      pcVar9 = *ppcVar1;
    } while (*ppcVar1 != (check_stack_entry *)0x0);
  }
  pvVar2 = pvVar4 + sVar3;
  pvVar10 = pvVar2;
  if (sVar3 != 0) {
    lVar11 = sVar3 * 0x28;
    do {
      lVar11 = lVar11 + -0x28;
      pvVar10 = pvVar4 + 1;
      if (lVar11 == 0) break;
      iVar7 = strcmp((pvVar10->name_).ptr_,(pvVar4->name_).ptr_);
      pvVar4 = pvVar10;
    } while (-1 < iVar7);
  }
  if (pvVar10 == pvVar2) {
    local_60.storage_ = (type)((long)".." + 1);
    pstore::gsl::not_null<const_char_*>::ensure_invariant((not_null<const_char_*> *)&local_60);
    d = find(this,(not_null<const_char_*>)local_60.storage_,1);
    local_60.storage_ = (type)0x12461c;
    pstore::gsl::not_null<const_char_*>::ensure_invariant((not_null<const_char_*> *)&local_60);
    d_00 = find(this,(not_null<const_char_*>)local_60.storage_,2);
    if (d_00.pos_ != pvVar2 && d.pos_ != pvVar2) {
      local_38.ptr_ = this;
      pstore::gsl::not_null<const_pstore::romfs::directory_*>::ensure_invariant(&local_38);
      bVar5 = anon_unknown.dwarf_10750b::is_expected_dir(d.pos_,local_38);
      if ((bVar5) &&
         (bVar5 = anon_unknown.dwarf_10750b::is_expected_dir
                            (d_00.pos_,(not_null<const_directory_*>)parent.ptr_), bVar5)) {
        if (this->size_ == 0) {
          return true;
        }
        __name = (this->members_).ptr_;
        lVar11 = this->size_ * 0x28;
        bVar5 = true;
        while( true ) {
          if ((__name->stat_).mode == directory) {
            dirent::opendir((dirent *)&local_60,(char *)__name);
            if (local_50 == false) {
              pnVar8 = error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
                       value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>const&,pstore::gsl::not_null<pstore::romfs::directory_const*>const>
                                 ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>
                                   *)&local_60);
              local_48.d.ptr_ = pnVar8->ptr_;
              local_48.prev = visited;
              pnVar8 = error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
                       value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>const&,pstore::gsl::not_null<pstore::romfs::directory_const*>const>
                                 ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>
                                   *)&local_60);
              this_00 = pnVar8->ptr_;
              local_68.ptr_ = this;
              pstore::gsl::not_null<const_pstore::romfs::directory_*>::ensure_invariant(&local_68);
              bVar6 = check(this_00,local_68,&local_48);
              bVar5 = (bool)(bVar5 & bVar6);
            }
            else {
              bVar6 = false;
              bVar5 = false;
            }
            if (local_50 == false) {
              error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
              value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>&,pstore::gsl::not_null<pstore::romfs::directory_const*>>
                        ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)
                         &local_60);
            }
            else {
              error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
              error_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>&,std::error_code>
                        ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)
                         &local_60);
            }
          }
          else {
            bVar6 = true;
          }
          if (bVar6 == false) break;
          __name = __name + 1;
          lVar11 = lVar11 + -0x28;
          if (lVar11 == 0) {
            return true;
          }
        }
        return bVar5;
      }
    }
  }
  return false;
}

Assistant:

bool directory::check (gsl::not_null<directory const *> const parent,
                               check_stack_entry const * const visited) const {
            auto const end = this->end ();

            // This stops us from looping forever if we follow a directory pointer to a directory
            // that we have already visited.
            for (auto const * v = visited; v != nullptr; v = v->prev) {
                if (v->d == parent) {
                    return true;
                }
            }

            // Check that the directory entries are sorted by name.
            if (!std::is_sorted (begin (), end, [] (dirent const & a, dirent const & b) {
                    return std::strcmp (a.name (), b.name ()) < 0;
                })) {
                return false;
            }

            // Look for the '.' and '..' entries and check that they point where we expect.
            iterator const dot = this->find (".");
            iterator const dot_dot = this->find ("..");
            if (dot == end || dot_dot == end) {
                return false;
            }
            if (!is_expected_dir (*dot, this) || !is_expected_dir (*dot_dot, parent)) {
                return false;
            }

            // Recursively check any directories contained by this one.
            for (dirent const & de : *this) {
                if (de.is_directory ()) {
                    if (auto const od = de.opendir ()) {
                        check_stack_entry const me{*od, visited};
                        if (!(*od)->check (this, &me)) {
                            // Error: recursive check failed.
                            return false;
                        }
                    } else {
                        // Error: this entry claimed to be a directory but opendir() failed.
                        return false;
                    }
                }
            }

            return true;
        }